

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdAddTapBranchByHash(void *handle,void *tree_handle,char *branch_hash)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  reference this;
  reference pvVar4;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  value_type *tree;
  value_type *branch;
  ByteData256 hash;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_fffffffffffffdf8;
  TapBranch *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined8 in_stack_fffffffffffffe18;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe20;
  TapBranch local_190;
  string local_110 [24];
  undefined8 in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  allocator local_e1;
  string local_e0;
  ByteData256 local_c0;
  long local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TapscriptTree",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x2f6;
    local_78.funcname = "CfdAddTapBranchByHash";
    cfd::core::logger::warn<>(&local_78,"branch_hash is null or empty.");
    local_9a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"Failed to parameter. branch_hash is null or empty.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe20,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    local_9a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a8 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,local_20,&local_e1);
  cfd::core::ByteData256::ByteData256(&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_a8 + 0x18));
  if (bVar1) {
    pvVar4 = std::
             vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::at
                       ((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                         *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    (*(pvVar4->super_TapBranch)._vptr_TapBranch[3])(pvVar4,&local_c0);
  }
  else {
    this = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                     ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                      in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_110,this);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_110);
    if ((bVar2 & 1) == 0) {
      (*this->_vptr_TapBranch[3])(this,&local_c0);
    }
    else {
      cfd::core::TapBranch::TapBranch(&local_190,&local_c0,*(NetType *)(local_a8 + 0x20));
      cfd::core::TapBranch::operator=(this,&local_190);
      cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffe00);
    }
  }
  local_4 = 0;
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5c9800);
  return local_4;
}

Assistant:

int CfdAddTapBranchByHash(
    void* handle, void* tree_handle, const char* branch_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(branch_hash)) {
      warn(CFD_LOG_SOURCE, "branch_hash is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_hash is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    ByteData256 hash(branch_hash);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(hash, buffer->net_type);  // override
      } else {
        branch.AddBranch(hash);
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      tree.AddBranch(hash);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}